

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomprops.c
# Opt level: O3

int identifyAtom(char *name,char *resname,int Verbose)

{
  char *__s;
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  char *__format;
  byte bVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  char warnresn [5];
  char warnstr [5];
  char local_28 [8];
  byte local_20 [8];
  
  bVar1 = *name;
  switch(bVar1) {
  case 0x20:
  case 0x22:
  case 0x27:
  case 0x2a:
  case 0x2b:
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x5f:
  case 0x60:
    bVar7 = name[1];
    switch(bVar7) {
    case 0x41:
      if (name[3] == '1') goto switchD_00120504_caseD_4f;
      if (name[3] == '2') goto switchD_00120504_caseD_4e;
      break;
    case 0x42:
      return 0x15;
    case 0x43:
      return 6;
    case 0x44:
      return 2;
    default:
      goto switchD_0012010c_caseD_45;
    case 0x46:
      return 10;
    case 0x48:
      bVar1 = name[2];
      if (bVar1 < 0x47) {
        if (bVar1 == 0x45) {
          iVar2 = fixAtomName(name,resname,2);
          bVar9 = iVar2 == 0;
          iVar2 = 0x2f;
        }
        else {
          if (bVar1 != 0x46) {
            return 2;
          }
          iVar2 = fixAtomName(name,resname,2);
          bVar9 = iVar2 == 0;
          iVar2 = 0x30;
        }
      }
      else if (bVar1 == 0x47) {
        iVar2 = fixAtomName(name,resname,2);
        bVar9 = iVar2 == 0;
        iVar2 = 0x31;
      }
      else {
        if (bVar1 != 0x4f) {
          return 2;
        }
        iVar2 = fixAtomName(name,resname,2);
        bVar9 = iVar2 == 0;
        iVar2 = 0x32;
      }
      if (!bVar9) {
        return iVar2;
      }
      return 2;
    case 0x49:
      return 0x33;
    case 0x4b:
      return 0x36;
    case 0x4e:
      return 8;
    case 0x4f:
      return 9;
    case 0x50:
      return 0xc;
    case 0x53:
      if (bVar1 != 0x20) {
        return 0xb;
      }
      if (name[2] != 'E') {
        return 0xb;
      }
      uVar5 = 0x57;
      bVar9 = true;
      goto switchD_0012031d_caseD_42;
    case 0x55:
      return 100;
    case 0x56:
      return 0x65;
    case 0x57:
      return 0x66;
    case 0x59:
      return 0x68;
    }
    goto switchD_00120504_caseD_41;
  default:
    bVar7 = name[1];
    break;
  case 0x41:
    bVar7 = name[1];
    switch(bVar7) {
    case 0x43:
      goto switchD_00120504_caseD_42;
    default:
      break;
    case 0x47:
      return 0xe;
    case 0x48:
      goto switchD_00120504_caseD_44;
    case 0x4c:
      return 0xf;
    case 0x4d:
      return 0x10;
    case 0x4e:
      goto switchD_00120504_caseD_4e;
    case 0x4f:
      goto switchD_00120504_caseD_4f;
    case 0x50:
      goto switchD_00120504_caseD_50;
    case 0x52:
      return 0x11;
    case 0x53:
      return 0x12;
    case 0x54:
      return 0x13;
    case 0x55:
      return 0x14;
    }
  case 0x42:
    bVar7 = name[1];
    if (bVar7 < 0x49) {
      if (bVar7 == 0x41) {
        return 0x16;
      }
      if (bVar7 == 0x45) {
        return 0x17;
      }
    }
    else {
      if (bVar7 == 0x49) {
        return 0x18;
      }
      if (bVar7 == 0x4b) {
        return 0x19;
      }
      if (bVar7 == 0x52) {
        return 0x1a;
      }
    }
    break;
  case 0x43:
    bVar9 = true;
    uVar5 = 6;
    switch(name[1]) {
    case 'A':
      return 0x1b;
    case 'D':
      return 0x1c;
    case 'E':
      return 0x1d;
    case 'F':
      return 0x1e;
    case 'H':
      goto switchD_00120504_caseD_44;
    case 'L':
      return 0x1f;
    case 'M':
      return 0x20;
    case 'N':
      goto switchD_00120504_caseD_4e;
    case 'O':
      uVar5 = 0x21;
      break;
    case 'P':
      goto switchD_00120504_caseD_50;
    case 'R':
      return 0x22;
    case 'S':
      return 0x23;
    case 'U':
      return 0x24;
    }
    goto switchD_0012031d_caseD_42;
  case 0x44:
    cVar4 = name[1];
    switch(cVar4) {
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
      break;
    case 'N':
      goto switchD_00120504_caseD_4e;
    case 'O':
      goto switchD_00120504_caseD_4f;
    case 'P':
      goto switchD_00120504_caseD_50;
    default:
      if (cVar4 == 'C') goto switchD_00120504_caseD_42;
      if (cVar4 == 'Y') {
        return 0x25;
      }
    }
    goto switchD_00120504_caseD_44;
  case 0x45:
    bVar7 = name[1];
    switch(bVar7) {
    case 0x43:
      goto switchD_00120504_caseD_42;
    default:
      break;
    case 0x48:
      goto switchD_00120504_caseD_44;
    case 0x4e:
      goto switchD_00120504_caseD_4e;
    case 0x4f:
      goto switchD_00120504_caseD_4f;
    case 0x50:
      goto switchD_00120504_caseD_50;
    case 0x52:
      return 0x26;
    case 0x53:
      return 0x27;
    case 0x55:
      return 0x28;
    }
  case 0x46:
    bVar7 = name[1];
    switch(bVar7) {
    case 0x43:
      goto switchD_00120504_caseD_42;
    default:
      break;
    case 0x45:
      return 0x29;
    case 0x48:
      goto switchD_00120504_caseD_44;
    case 0x4d:
      return 0x2a;
    case 0x4e:
      goto switchD_00120504_caseD_4e;
    case 0x4f:
      goto switchD_00120504_caseD_4f;
    case 0x50:
      goto switchD_00120504_caseD_50;
    case 0x52:
      return 0x2b;
    }
  case 0x47:
    bVar7 = name[1];
    switch(bVar7) {
    case 0x41:
      return 0x2c;
    default:
      break;
    case 0x43:
      goto switchD_00120504_caseD_42;
    case 0x44:
      return 0x2d;
    case 0x45:
      return 0x2e;
    case 0x48:
      goto switchD_00120504_caseD_44;
    case 0x4e:
      goto switchD_00120504_caseD_4e;
    case 0x4f:
      goto switchD_00120504_caseD_4f;
    case 0x50:
      goto switchD_00120504_caseD_50;
    }
  case 0x48:
    bVar1 = name[1];
    if (bVar1 < 0x47) {
      if (bVar1 == 0x45) {
        iVar2 = fixAtomName(name,resname,1);
        bVar9 = iVar2 == 0;
        iVar2 = 0x2f;
      }
      else {
        if (bVar1 != 0x46) {
          return 2;
        }
        iVar2 = fixAtomName(name,resname,1);
        bVar9 = iVar2 == 0;
        iVar2 = 0x30;
      }
    }
    else if (bVar1 == 0x47) {
      iVar2 = fixAtomName(name,resname,1);
      bVar9 = iVar2 == 0;
      iVar2 = 0x31;
    }
    else {
      if (bVar1 != 0x4f) {
        return 2;
      }
      iVar2 = fixAtomName(name,resname,1);
      bVar9 = iVar2 == 0;
      iVar2 = 0x32;
    }
    if (!bVar9) {
      return iVar2;
    }
    return 2;
  case 0x49:
    bVar7 = name[1];
    if (bVar7 == 0x4e) {
      return 0x34;
    }
    if (bVar7 == 0x52) {
      return 0x35;
    }
    break;
  case 0x4b:
    bVar7 = name[1];
    if (bVar7 == 0x52) {
      return 0x37;
    }
    break;
  case 0x4c:
    bVar7 = name[1];
    if (bVar7 == 0x41) {
      return 0x38;
    }
    if (bVar7 == 0x55) {
      return 0x3a;
    }
    if (bVar7 == 0x49) {
      return 0x39;
    }
    break;
  case 0x4d:
    bVar7 = name[1];
    if (bVar7 < 0x4e) {
      if (bVar7 == 0x44) {
        return 0x3b;
      }
      if (bVar7 == 0x47) {
        return 0x3c;
      }
    }
    else {
      if (bVar7 == 0x4e) {
        return 0x3d;
      }
      if (bVar7 == 0x4f) {
        return 0x3e;
      }
    }
    break;
  case 0x4e:
    bVar9 = true;
    switch(name[1]) {
    case 'A':
      uVar5 = 0x3f;
      break;
    case 'B':
      uVar5 = 0x40;
      break;
    case 'C':
      goto switchD_00120504_caseD_42;
    case 'D':
      uVar5 = 0x41;
      break;
    case 'E':
      uVar5 = 0x42;
      break;
    default:
      goto switchD_00120504_caseD_4e;
    case 'H':
      goto switchD_00120504_caseD_44;
    case 'I':
      return 0x43;
    case 'O':
      goto switchD_00120504_caseD_4f;
    case 'P':
      goto switchD_00120504_caseD_50;
    case 'S':
      goto switchD_00120504_caseD_53;
    }
    goto switchD_0012031d_caseD_42;
  case 0x4f:
    bVar9 = name[1] != 'S';
    uVar5 = 0x46;
    if (bVar9) {
      uVar5 = 9;
    }
    goto switchD_0012031d_caseD_42;
  case 0x50:
    bVar7 = name[1];
    bVar9 = true;
    if (bVar7 < 0x4d) {
      if (bVar7 == 0x41) {
        uVar5 = 0x47;
        goto switchD_0012031d_caseD_42;
      }
      if (bVar7 == 0x42) {
        uVar5 = 0x48;
        goto switchD_0012031d_caseD_42;
      }
      if (bVar7 == 0x44) {
        uVar5 = 0x49;
        goto switchD_0012031d_caseD_42;
      }
    }
    else {
      switch(bVar7) {
      case 0x4d:
        return 0x4a;
      case 0x4f:
        return 0x4b;
      case 0x52:
        return 0x4c;
      case 0x54:
        return 0x4d;
      case 0x55:
        return 0x4e;
      }
    }
    goto switchD_00120504_caseD_50;
  case 0x52:
    bVar7 = name[1];
    switch(bVar7) {
    case 0x41:
      return 0x4f;
    case 0x42:
      return 0x50;
    case 0x43:
    case 0x44:
    case 0x46:
    case 0x47:
      break;
    case 0x45:
      return 0x51;
    case 0x48:
      return 0x52;
    default:
      if (bVar7 == 0x4e) {
        return 0x53;
      }
      if (bVar7 == 0x55) {
        return 0x54;
      }
    }
    break;
  case 0x53:
    bVar9 = true;
    switch(name[1]) {
    case 'B':
      uVar5 = 0x55;
      break;
    case 'C':
      return 0x56;
    default:
      goto switchD_00120504_caseD_53;
    case 'E':
      uVar5 = 0x57;
      break;
    case 'I':
      return 0x58;
    case 'M':
      return 0x59;
    case 'N':
      return 0x5a;
    case 'R':
      return 0x5b;
    }
    goto switchD_0012031d_caseD_42;
  case 0x54:
    bVar7 = name[1];
    uVar5 = bVar7 - 0x41;
    if (((byte)uVar5 < 0xd) && ((0x1997U >> (uVar5 & 0x1f) & 1) != 0)) {
      return *(int *)(&DAT_001364a0 + (ulong)(uVar5 & 0xff) * 4);
    }
    break;
  case 0x58:
    bVar7 = name[1];
    if (bVar7 == 0x45) {
      return 0x67;
    }
    break;
  case 0x59:
    bVar7 = name[1];
    if (bVar7 == 0x42) {
      return 0x69;
    }
    break;
  case 0x5a:
    bVar7 = name[1];
    if (bVar7 == 0x4e) {
      return 0x6a;
    }
    if (bVar7 == 0x52) {
      return 0x6b;
    }
  }
switchD_0012010c_caseD_45:
  bVar9 = true;
  switch(bVar7) {
  case 0x41:
switchD_00120504_caseD_41:
    bVar9 = true;
    bVar7 = name[2];
    uVar5 = 6;
    if (bVar7 < 0x53) {
      if (bVar7 == 0x47) {
        uVar5 = 0xe;
      }
      else if (bVar7 == 0x4c) {
        uVar5 = 0xf;
      }
    }
    else if (bVar7 == 0x53) {
      uVar5 = 0x12;
    }
    else if (bVar7 == 0x55) {
      uVar5 = 0x14;
    }
    break;
  default:
switchD_00120504_caseD_42:
    bVar9 = true;
    uVar5 = 6;
    break;
  case 0x44:
  case 0x48:
switchD_00120504_caseD_44:
    bVar9 = true;
    uVar5 = 2;
    break;
  case 0x46:
    bVar10 = name[2] == 'E';
    uVar8 = 0x29;
    goto LAB_001207bc;
  case 0x47:
    bVar10 = name[2] == 'D';
    uVar8 = 0x2d;
    goto LAB_001207bc;
  case 0x49:
    uVar5 = 0x33;
    break;
  case 0x4b:
    uVar5 = 0x36;
    break;
  case 0x4c:
    bVar10 = name[2] == 'I';
    uVar8 = 0x39;
    goto LAB_001207bc;
  case 0x4d:
    cVar4 = name[2];
    if (cVar4 == 'O') {
      uVar5 = 0x3e;
    }
    else if (cVar4 == 'N') {
      uVar5 = 0x3d;
    }
    else {
      uVar5 = 6;
      if (cVar4 == 'G') {
        uVar5 = 0x3c;
      }
    }
    break;
  case 0x4e:
switchD_00120504_caseD_4e:
    bVar9 = true;
    uVar5 = 8;
    break;
  case 0x4f:
switchD_00120504_caseD_4f:
    bVar9 = true;
    uVar5 = 9;
    break;
  case 0x50:
switchD_00120504_caseD_50:
    bVar9 = true;
    uVar5 = 0xc;
    break;
  case 0x53:
switchD_00120504_caseD_53:
    bVar9 = true;
    uVar5 = 0xb;
    break;
  case 0x55:
    uVar5 = 100;
    break;
  case 0x56:
    uVar5 = 0x65;
    break;
  case 0x57:
    uVar5 = 0x66;
    break;
  case 0x5a:
    bVar10 = name[2] == 'N';
    uVar8 = 0x6a;
LAB_001207bc:
    uVar5 = 6;
    if (bVar10) {
      uVar5 = uVar8;
    }
  }
switchD_0012031d_caseD_42:
  if (!(bool)(bVar9 ^ 1U | Verbose == 0)) {
    local_20[0] = 0x5f;
    local_20[1] = 0x5f;
    local_20[2] = 0x5f;
    local_20[3] = 0x5f;
    local_20[4] = 0;
    builtin_strncpy(local_28,"____",5);
    if (bVar1 != 0) {
      lVar6 = 0;
      do {
        if (local_20[lVar6] == 0) break;
        if (bVar1 == 0x20) {
          bVar1 = 0x5f;
        }
        local_20[lVar6] = bVar1;
        bVar1 = name[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while (bVar1 != 0);
    }
    cVar4 = *resname;
    if (cVar4 != '\0') {
      lVar6 = 0;
      do {
        if (local_28[lVar6] == '\0') break;
        if (name[lVar6] == ' ') {
          cVar4 = '_';
        }
        local_28[lVar6] = cVar4;
        cVar4 = resname[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while (cVar4 != '\0');
    }
    __s = AtomTblIndex[uVar5]->name;
    sVar3 = strlen(__s);
    __format = "WARNING: atom %s from resn %s will be treated as %s\n";
    if (sVar3 == 1) {
      __format = "WARNING: atom %s from resn %s will be treated as  %s\n";
    }
    fprintf(_stderr,__format,local_20,local_28,__s);
  }
  return uVar5;
}

Assistant:

int identifyAtom(char* name, char resname[], int Verbose) {  /*dcr041007 allow warning choice*/
   int n = -1, emitWarning = 0;

   switch(name[0]) {
   case '*': case '\'': case '"': case '`': case '_':
   case '+': case '-':  case ' ':
   case '0': case '1': case '2': case '3': case '4':
   case '5': case '6': case '7': case '8': case '9':
      switch(name[1]) {
      case 'A':
	 switch(name[3]) {
	 case '1': n = atomO; emitWarning = 1; break;
	 case '2': n = atomN; emitWarning = 1; break;
	 } break;
      case 'B': n = atomB; break;
      case 'C': n = atomC; break;
      case 'D': n = atomH; break;
      case 'F': n = atomF; break;
      case 'H':
        switch(name[2]) {
        case 'E': n = fixAtomName(name,resname,2) ? atomHe : atomH; break;
        case 'F': n = fixAtomName(name,resname,2) ? atomHf : atomH; break;
        case 'G': n = fixAtomName(name,resname,2) ? atomHg : atomH; break;
        case 'O': n = fixAtomName(name,resname,2) ? atomHo : atomH; break;
/*        case 'S': n = fixAtomName(name,resname,2) ? atomHs : atomH; break; */
        default : n = atomH; break;
        } break;
      case 'I': n = atomI; break;
      case 'K': n = atomK; break;
      case 'N': n = atomN; break;
      case 'O': n = atomO; break;
      case 'P': n = atomP; break;
    /*case 'S': n = atomS; break;*/
      case 'S':
         if(name[0] == ' ' && name[2] == 'E')
         {/*_SE likely refmac,cns missplaced Selenium atom name dcr041007*/
                n = atomSe; emitWarning = 1; break;
         }
         else  {n = atomS; break;} /*050121 NO warning for other S*/
      case 'U': n = atomU; break;
      case 'V': n = atomV; break;
      case 'W': n = atomW; break;
      case 'Y': n = atomY; break;
      } break;
   case 'A':
      switch(name[1]) {
      case 'C': n = atomC;  emitWarning = 1;break;/*nonstd!*/
      case 'G': n = atomAg; break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'L': n = atomAl; break;
      case 'M': n = atomAm; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      case 'R': n = atomAr; break;
      case 'S': n = atomAs; break;
      case 'T': n = atomAt; break;
      case 'U': n = atomAu; break;
      } break;
   case 'B':
      switch(name[1]) {
      case 'A': n = atomBa; break;
      case 'E': n = atomBe; break;
      case 'I': n = atomBi; break;
      case 'K': n = atomBk; break;
      case 'R': n = atomBr; break;
      } break;
   case 'C':
      switch(name[1]) {
      case 'A': n = atomCa; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'D': n = atomCd; break;
      case 'E': n = atomCe; break;
      case 'F': n = atomCf; break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'L': n = atomCl; break;
      case 'M': n = atomCm; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomCo; emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      case 'R': n = atomCr; break;
      case 'S': n = atomCs; break;
      case 'U': n = atomCu; break;
      default:  n = atomC;  emitWarning = 1;break;
      } break;
   case 'D':
      switch(name[1]) {
      case 'Y': n = atomDy; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      default:  n = atomH;  emitWarning = 1;break;
      } break;
   case 'E':
      switch(name[1]) {
      case 'R': n = atomEr; break;
      case 'S': n = atomEs; break;
      case 'U': n = atomEu; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'F':
      switch(name[1]) {
      case 'E': n = atomFe; break;
      case 'M': n = atomFm; break;
      case 'R': n = atomFr; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'G':
      switch(name[1]) {
      case 'A': n = atomGa; break;
      case 'D': n = atomGd; break;
      case 'E': n = atomGe; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'H':
      switch(name[1]) {
      case 'E': n = fixAtomName(name,resname,1) ? atomHe : atomH; break;
      case 'F': n = fixAtomName(name,resname,1) ? atomHf : atomH; break;
      case 'G': n = fixAtomName(name,resname,1) ? atomHg : atomH; break;
      case 'O': n = fixAtomName(name,resname,1) ? atomHo : atomH; break;
/*      case 'S': n = fixAtomName(name,resname,1) ? atomHs : atomH; break; */
      default : n = atomH; break;
      } break;

/*    case 'E': */
/*  if (isdigit(name[2])) { n = atomH; emitWarning = 1;} */ /* Hepsilon?? */
/*  else {n = atomHe; emitWarning = 1;} */
/*  break; */
/*      case 'F': n = atomHf; emitWarning = 1;break; */
/*      case 'G': */
/*  if (isdigit(name[2])) { n = atomH; emitWarning = 1;} */ /* Hgamma?? */
/*  else {n = atomHg; emitWarning = 1;} */
/*  break; */
/*      case 'O': n = atomHo; emitWarning = 1;break; */
/*      default:  n = atomH;  emitWarning = 1;break; */
/*      } break; */

   case 'I':
      switch(name[1]) {
      case 'N': n = atomIn; break;
      case 'R': n = atomIr; break;
      } break;
   case 'K':
      if (name[1] == 'R') n = atomKr; break;
   case 'L':
      switch(name[1]) {
      case 'A': n = atomLa; break;
      case 'I': n = atomLi; break;
      case 'U': n = atomLu; break;
      } break;
   case 'M':
      switch(name[1]) {
      case 'D': n = atomMd; break;
      case 'G': n = atomMg; break;
      case 'N': n = atomMn; break;
      case 'O': n = atomMo; break;
      } break;
   case 'N':
      switch(name[1]) {
      case 'A': n = atomNa; emitWarning = 1;break;
      case 'B': n = atomNb; emitWarning = 1;break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'D': n = atomNd; emitWarning = 1;break;
      case 'E': n = atomNe; emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'I': n = atomNi; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;/*nonstd!*/
      case 'P': n = atomP;  emitWarning = 1;break;/*nonstd!*/
      case 'S': n = atomS;  emitWarning = 1;break;
      default:  n = atomN;  emitWarning = 1;break;
      } break;
   case 'O':
      switch(name[1]) {
      case 'S': n = atomOs; break;
      default:  n = atomO;  emitWarning = 1;break;
      } break;
   case 'P':
      switch(name[1]) {
      case 'A': n = atomPa; emitWarning = 1;break;
      case 'B': n = atomPb; emitWarning = 1;break;
      case 'D': n = atomPd; emitWarning = 1;break;
      case 'M': n = atomPm; break;
      case 'O': n = atomPo; break;
      case 'R': n = atomPr; break;
      case 'T': n = atomPt; break;
      case 'U': n = atomPu; break;
      default:  n = atomP;  emitWarning = 1;break;
      } break;
   case 'R':
      switch(name[1]) {
      case 'A': n = atomRa; break;
      case 'B': n = atomRb; break;
      case 'E': n = atomRe; break;
      case 'H': n = atomRh; break;
      case 'N': n = atomRn; break;
      case 'U': n = atomRu; break;
      } break;
   case 'S':
      switch(name[1]) {
      case 'B': n = atomSb; emitWarning = 1;break;
      case 'C': n = atomSc; break;
      case 'E': n = atomSe; emitWarning = 1;break;
      case 'I': n = atomSi; break;
      case 'M': n = atomSm; break;
      case 'N': n = atomSn; break;
      case 'R': n = atomSr; break;
      default:  n = atomS;  emitWarning = 1;break;
      } break;
   case 'T':
      switch(name[1]) {
      case 'A': n = atomTa; break;
      case 'B': n = atomTb; break;
      case 'C': n = atomTc; break;
      case 'E': n = atomTe; break;
      case 'H': n = atomTh; break;
      case 'I': n = atomTi; break;
      case 'L': n = atomTl; break;
      case 'M': n = atomTm; break;
      } break;
   case 'X':
      if (name[1] == 'E') n = atomXe; break;
   case 'Y':
      if (name[1] == 'B') n = atomYb; break;
   case 'Z':
      switch(name[1]) {
      case 'N': n = atomZn; break;
      case 'R': n = atomZr; break;
      } break;
   default: break;
   }

   if (n < 0) { emitWarning = 1;
      n = atomC;

      switch(name[1]) {
      case 'H': case 'D': n = atomH; break;
      case 'C': n = atomC; break;
      case 'N': n = atomN; break;
      case 'O': n = atomO; break;
      case 'P': n = atomP; break;
      case 'S': n = atomS; break;

      case 'I': n = atomI; break;
      case 'K': n = atomK; break;
      case 'V': n = atomV; break;
      case 'W': n = atomW; break;
      case 'U': n = atomU; break;

      case 'A':
	 switch(name[2]) {
	 case 'G': n = atomAg; break;
	 case 'L': n = atomAl; break;
	 case 'S': n = atomAs; break;
	 case 'U': n = atomAu; break;
	 } break;
      case 'F':
	 if (name[2] == 'E') n = atomFe; break;
      case 'G':
	 if (name[2] == 'D') n = atomGd; break;
      case 'L':
	 if (name[2] == 'I') n = atomLi; break;
      case 'M':
	 switch(name[2]) {
	 case 'G': n = atomMg; break;
	 case 'N': n = atomMn; break;
	 case 'O': n = atomMo; break;
	 } break;
      case 'Z':
	 if (name[2] == 'N') n = atomZn; break;
/* --------- default if we fall through... ---------------------*/
      default: n = atomC; break;
      }
   }
   if (emitWarning && Verbose) {/*Verbose controlled dcr041007*/
      char warnstr[5]={'_','_','_','_','\0'}; /*dcr041007*/
      char warnresn[5]={'_','_','_','_','\0'}; /*rmi070719*/
      char* atstr;
      int j=0;
      while(name[j]!='\0'&&warnstr[j]!='\0')
      {/*explicitly show blanks so can understand atom name problem*/
         if(name[j]==' ') {warnstr[j]='_';}
         else             {warnstr[j]=name[j];}
         j++;
      }
      j=0;
      while(resname[j]!='\0'&&warnresn[j]!='\0')
      {/*explicitly show blanks so can understand residue/atom name problem*/
         if(name[j]==' ') {warnresn[j]='_';}
         else             {warnresn[j]=resname[j];}
         j++;
      }
      atstr = getAtomName(n);
      if(strlen(atstr)==1)
           {fprintf(stderr,"WARNING: atom %s from resn %s will be treated as  %s\n",warnstr,warnresn,atstr);}
      else {fprintf(stderr,"WARNING: atom %s from resn %s will be treated as %s\n",warnstr,warnresn,atstr);}
         /*name, getAtomName(n));*/
   }

   return n;
}